

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O2

void __thiscall Potassco::TheoryData::setCondition(TheoryData *this,Id_t elementId,Id_t newCond)

{
  uint *puVar1;
  TheoryElement *pTVar2;
  
  pTVar2 = getElement(this,elementId);
  if (((int)*pTVar2 < 0) &&
     (pTVar2[(ulong)((uint)*pTVar2 & 0x7fffffff) + 1] == (TheoryElement)0xffffffff)) {
    puVar1 = *(uint **)((long)(this->data_->elems).mem.beg_ + (ulong)elementId * 8);
    puVar1[(ulong)(*puVar1 & 0x7fffffff) + 1] = newCond;
    return;
  }
  fail(-1,"void Potassco::TheoryData::setCondition(Id_t, Id_t)",0x104,
       "getElement(elementId).condition() == COND_DEFERRED",(char *)0x0);
}

Assistant:

void TheoryData::setCondition(Id_t elementId, Id_t newCond) {
	POTASSCO_ASSERT(getElement(elementId).condition() == COND_DEFERRED);
	elems()[elementId]->setCondition(newCond);
}